

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildTokenTestCompleteThreeStepsSerial::Run(BuildTokenTestCompleteThreeStepsSerial *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  size_type sVar4;
  reference pvVar5;
  bool local_dc;
  bool local_da;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  BuildTokenTestCompleteThreeStepsSerial *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cat12",&local_51);
  pNVar3 = Builder::AddTarget(&(this->super_BuildTokenTest).super_BuildTest.builder_,&local_50,
                              (string *)local_30);
  testing::Test::Check
            (pTVar1,pNVar3 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10ca,"builder_.AddTarget(\"cat12\", &err)");
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x10cb,"\"\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
    goto LAB_00169afc;
  }
  BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,4,1,1,1);
  BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,4,1,0,1);
  BuildTokenTest::ExpectWaitForCommand(&this->super_BuildTokenTest,3,1,0);
  pTVar1 = g_current_test;
  bVar2 = Builder::Build(&(this->super_BuildTokenTest).super_BuildTest.builder_,(string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d3,"builder_.Build(&err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d4,"\"\" == err");
  pTVar1 = g_current_test;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_BuildTokenTest).token_command_runner_.commands_ran_);
  testing::Test::Check
            (pTVar1,sVar4 == 3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d6,"3u == token_command_runner_.commands_ran_.size()");
  pTVar1 = g_current_test;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,0);
  bVar2 = std::operator==(pvVar5,"cat in1 > cat1");
  if (bVar2) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,1);
    bVar2 = std::operator==(pvVar5,"cat in1 in2 > cat2");
    local_da = true;
    if (!bVar2) goto LAB_001699d8;
  }
  else {
LAB_001699d8:
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,0);
    bVar2 = std::operator==(pvVar5,"cat in1 in2 > cat2");
    local_dc = false;
    if (bVar2) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,1);
      local_dc = std::operator==(pvVar5,"cat in1 > cat1");
    }
    local_da = local_dc;
  }
  testing::Test::Check
            (pTVar1,local_da,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10da,
             "(token_command_runner_.commands_ran_[0] == \"cat in1 > cat1\" && token_command_runner_.commands_ran_[1] == \"cat in1 in2 > cat2\") || (token_command_runner_.commands_ran_[0] == \"cat in1 in2 > cat2\" && token_command_runner_.commands_ran_[1] == \"cat in1 > cat1\" )"
            );
  pTVar1 = g_current_test;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,2);
  bVar2 = std::operator==(pvVar5,"cat cat1 cat2 > cat12");
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10db,"token_command_runner_.commands_ran_[2] == \"cat cat1 cat2 > cat12\"");
LAB_00169afc:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTokenTest, CompleteThreeStepsSerial) {
  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat12", &err));
  ASSERT_EQ("", err);

  // allow running of all commands
  ExpectCanRunMore(4,     true, true,  true,  true);
  ExpectAcquireToken(4,   true, false, true,  true);
  // wait for commands to finalize
  ExpectWaitForCommand(3, true, false, false);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(3u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > cat1"     &&
               token_command_runner_.commands_ran_[1] == "cat in1 in2 > cat2") ||
              (token_command_runner_.commands_ran_[0] == "cat in1 in2 > cat2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > cat1"    ));
  EXPECT_TRUE(token_command_runner_.commands_ran_[2] == "cat cat1 cat2 > cat12");
}